

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

StringTree * __thiscall
capnp::JsonCodec::Impl::encodeList
          (StringTree *__return_storage_ptr__,Impl *this,Array<kj::StringTree> *elements,
          bool hasMultilineElement,uint indent,bool *multiline,bool hasPrefix)

{
  StringPtr delim_00;
  StringTree *pSVar1;
  size_t sVar2;
  String *pSVar3;
  Array<kj::StringTree> *pieces;
  ulong uVar4;
  Repeat<char> *params_1;
  undefined4 in_register_00000084;
  Repeat<char> RVar5;
  StringTree local_1f8;
  StringPtr local_1c0;
  StringPtr local_1b0;
  StringPtr local_1a0;
  StringPtr local_190;
  StringPtr local_180;
  String local_170;
  StringPtr local_158;
  String local_148;
  StringPtr local_130;
  char local_119;
  char local_118 [8];
  Repeat<char> indentSpace;
  char *local_100;
  StringPtr local_f8;
  StringPtr local_e8 [2];
  undefined1 local_c8 [8];
  String ownDelim;
  String ownPrefix;
  StringPtr suffix;
  StringPtr delim;
  StringPtr prefix;
  StringTree *e;
  StringTree *__end2;
  StringTree *__begin2;
  Array<kj::StringTree> *__range2;
  size_t maxChildSize;
  bool *pbStack_30;
  bool hasPrefix_local;
  bool *multiline_local;
  uint indent_local;
  bool hasMultilineElement_local;
  Array<kj::StringTree> *elements_local;
  Impl *this_local;
  
  maxChildSize._7_1_ = hasPrefix;
  __range2 = (Array<kj::StringTree> *)0x0;
  pbStack_30 = multiline;
  multiline_local._0_4_ = indent;
  multiline_local._7_1_ = hasMultilineElement;
  _indent_local = elements;
  elements_local = (Array<kj::StringTree> *)this;
  this_local = (Impl *)__return_storage_ptr__;
  __end2 = kj::Array<kj::StringTree>::begin(elements);
  pSVar1 = kj::Array<kj::StringTree>::end(elements);
  for (; __end2 != pSVar1; __end2 = __end2 + 1) {
    prefix.content.size_ = kj::StringTree::size(__end2);
    __range2 = (Array<kj::StringTree> *)
               kj::max<unsigned_long&,unsigned_long>
                         ((unsigned_long *)&__range2,&prefix.content.size_);
  }
  kj::StringPtr::StringPtr((StringPtr *)&delim.content.size_);
  kj::StringPtr::StringPtr((StringPtr *)&suffix.content.size_);
  kj::StringPtr::StringPtr((StringPtr *)&ownPrefix.content.disposer);
  kj::String::String((String *)&ownDelim.content.disposer);
  kj::String::String((String *)local_c8);
  if ((this->prettyPrint & 1U) == 0) {
    kj::StringPtr::StringPtr(local_e8,",");
    suffix.content.size_ = (size_t)local_e8[0].content.ptr;
    delim.content.ptr = (char *)local_e8[0].content.size_;
    kj::StringPtr::StringPtr(&local_f8,"");
    delim.content.size_ = (size_t)local_f8.content.ptr;
    prefix.content.ptr = (char *)local_f8.content.size_;
    kj::StringPtr::StringPtr((StringPtr *)&indentSpace.count,"");
    ownPrefix.content.disposer = (ArrayDisposer *)indentSpace.count;
    suffix.content.ptr = local_100;
  }
  else {
    sVar2 = kj::Array<kj::StringTree>::size(elements);
    if ((sVar2 < 2) ||
       (((multiline_local._7_1_ & 1) == 0 && (__range2 < (Array<kj::StringTree> *)0x33)))) {
      kj::StringPtr::StringPtr(&local_1a0,", ");
      suffix.content.size_ = (size_t)local_1a0.content.ptr;
      delim.content.ptr = (char *)local_1a0.content.size_;
      kj::StringPtr::StringPtr(&local_1b0,"");
      delim.content.size_ = (size_t)local_1b0.content.ptr;
      prefix.content.ptr = (char *)local_1b0.content.size_;
      kj::StringPtr::StringPtr(&local_1c0,"");
      ownPrefix.content.disposer = (ArrayDisposer *)local_1c0.content.ptr;
      suffix.content.ptr = (char *)local_1c0.content.size_;
    }
    else {
      local_119 = ' ';
      uVar4 = (ulong)(uint)multiline_local;
      RVar5 = kj::repeat<char>(&local_119,(ulong)((uint)multiline_local * 2 + 2));
      indentSpace._0_8_ = RVar5.count;
      local_118[0] = RVar5.value;
      params_1 = (Repeat<char> *)CONCAT71((int7)(uVar4 >> 8),local_118[0]);
      kj::str<char_const(&)[3],kj::Repeat<char>&>
                (&local_148,(kj *)",\n",(char (*) [3])local_118,params_1);
      pSVar3 = kj::String::operator=((String *)local_c8,&local_148);
      kj::StringPtr::StringPtr(&local_130,pSVar3);
      suffix.content.size_ = (size_t)local_130.content.ptr;
      delim.content.ptr = (char *)local_130.content.size_;
      kj::String::~String(&local_148);
      *pbStack_30 = true;
      if ((maxChildSize._7_1_ & 1) == 0) {
        kj::StringPtr::StringPtr(&local_180," ");
        delim.content.size_ = (size_t)local_180.content.ptr;
        prefix.content.ptr = (char *)local_180.content.size_;
      }
      else {
        kj::str<char_const(&)[2],kj::Repeat<char>&>
                  (&local_170,(kj *)0xa6d9de,(char (*) [2])local_118,params_1);
        pSVar3 = kj::String::operator=((String *)&ownDelim.content.disposer,&local_170);
        kj::StringPtr::StringPtr(&local_158,pSVar3);
        delim.content.size_ = (size_t)local_158.content.ptr;
        prefix.content.ptr = (char *)local_158.content.size_;
        kj::String::~String(&local_170);
      }
      kj::StringPtr::StringPtr(&local_190," ");
      ownPrefix.content.disposer = (ArrayDisposer *)local_190.content.ptr;
      suffix.content.ptr = (char *)local_190.content.size_;
    }
  }
  pieces = kj::mv<kj::Array<kj::StringTree>>(elements);
  delim_00.content.size_ = (size_t)delim.content.ptr;
  delim_00.content.ptr = (char *)suffix.content.size_;
  kj::StringTree::StringTree(&local_1f8,pieces,delim_00);
  kj::strTree<kj::StringPtr&,kj::StringTree,kj::StringPtr&>
            (__return_storage_ptr__,(kj *)&delim.content.size_,(StringPtr *)&local_1f8,
             (StringTree *)&ownPrefix.content.disposer,
             (StringPtr *)CONCAT44(in_register_00000084,indent));
  kj::StringTree::~StringTree(&local_1f8);
  kj::String::~String((String *)local_c8);
  kj::String::~String((String *)&ownDelim.content.disposer);
  return __return_storage_ptr__;
}

Assistant:

kj::StringTree encodeList(kj::Array<kj::StringTree> elements,
                            bool hasMultilineElement, uint indent, bool& multiline,
                            bool hasPrefix) const {
    size_t maxChildSize = 0;
    for (auto& e: elements) maxChildSize = kj::max(maxChildSize, e.size());

    kj::StringPtr prefix;
    kj::StringPtr delim;
    kj::StringPtr suffix;
    kj::String ownPrefix;
    kj::String ownDelim;
    if (!prettyPrint) {
      // No whitespace.
      delim = ",";
      prefix = "";
      suffix = "";
    } else if ((elements.size() > 1) && (hasMultilineElement || maxChildSize > 50)) {
      // If the array contained any multi-line elements, OR it contained sufficiently long
      // elements, then put each element on its own line.
      auto indentSpace = kj::repeat(' ', (indent + 1) * 2);
      delim = ownDelim = kj::str(",\n", indentSpace);
      multiline = true;
      if (hasPrefix) {
        // We're producing a multi-line list, and the first line has some garbage in front of it.
        // Therefore, move the first element to the next line.
        prefix = ownPrefix = kj::str("\n", indentSpace);
      } else {
        prefix = " ";
      }
      suffix = " ";
    } else {
      // Put everything on one line, but add spacing between elements for legibility.
      delim = ", ";
      prefix = "";
      suffix = "";
    }

    return kj::strTree(prefix, kj::StringTree(kj::mv(elements), delim), suffix);
  }